

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O2

void __thiscall StatAggregator::StatAggregator(StatAggregator *this,int _num_stats,int _num_samples)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  StatMatrix_t ppsVar4;
  ulong *puVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = (ulong)_num_samples;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  uVar3 = SUB168(auVar1 * ZEXT816(0x38),0);
  uVar2 = 0xffffffffffffffff;
  uVar11 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar11 = uVar2;
  }
  uVar8 = 0;
  uVar3 = (ulong)(uint)_num_stats << 3;
  if (_num_stats < 0) {
    uVar3 = uVar2;
  }
  uVar9 = 0;
  if (0 < _num_stats) {
    uVar9 = (ulong)(uint)_num_stats;
  }
  this->num_stats = _num_stats;
  this->num_samples = _num_samples;
  if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
    uVar11 = uVar2;
  }
  ppsVar4 = (StatMatrix_t)operator_new__(uVar3);
  this->t_stats = ppsVar4;
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    puVar5 = (ulong *)operator_new__(uVar11);
    *puVar5 = uVar10;
    if (_num_samples != 0) {
      puVar6 = puVar5 + 3;
      lVar7 = uVar10 * 0x38;
      do {
        puVar6[-2] = (ulong)puVar6;
        puVar6[-1] = 0;
        *(undefined1 *)puVar6 = 0;
        puVar6[4] = 0;
        puVar6[2] = 0;
        puVar6[3] = 0;
        puVar6 = puVar6 + 7;
        lVar7 = lVar7 + -0x38;
      } while (lVar7 != 0);
    }
    this->t_stats[uVar8] = (stat_history_t *)(puVar5 + 1);
  }
  return;
}

Assistant:

StatAggregator::StatAggregator(int _num_stats, int _num_samples) {

    num_stats = _num_stats;
    num_samples = _num_samples;
    t_stats = new stat_history_t*[num_stats];
    for (int i = 0; i < num_stats; ++i) {
        t_stats[i] = new stat_history_t[num_samples];
    }
}